

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3auxConnectMethod
              (sqlite3 *db,void *pUnused,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  sqlite3_module *__dest;
  char *__s;
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t __n;
  sqlite3_vtab *__s_00;
  sqlite3_uint64 n;
  char *__s_01;
  long lStack_50;
  
  if (argc - 6U < 0xfffffffe) {
LAB_0019dc3d:
    sqlite3Fts3ErrMsg(pzErr,"invalid arguments to fts4aux constructor");
    iVar2 = 1;
  }
  else {
    __s_01 = argv[1];
    sVar3 = strlen(__s_01);
    iVar1 = (int)sVar3;
    if (argc == 5) {
      if ((iVar1 != 4) || (iVar1 = sqlite3_strnicmp("temp",__s_01,4), iVar1 != 0))
      goto LAB_0019dc3d;
      __s_01 = argv[3];
      sVar3 = strlen(__s_01);
      iVar1 = (int)sVar3;
      lStack_50 = 0x20;
    }
    else {
      lStack_50 = 0x18;
    }
    __s = *(char **)((long)argv + lStack_50);
    sVar3 = strlen(__s);
    iVar2 = sqlite3_declare_vtab
                      (db,"CREATE TABLE x(term, col, documents, occurrences, languageid HIDDEN)");
    if (iVar2 == 0) {
      __n = (size_t)iVar1;
      n = __n + (long)(int)sVar3 + 0x22a;
      __s_00 = (sqlite3_vtab *)sqlite3_malloc64(n);
      if (__s_00 == (sqlite3_vtab *)0x0) {
        iVar2 = 7;
      }
      else {
        iVar2 = 0;
        memset(__s_00,0,n);
        __s_00[1].pModule = (sqlite3_module *)&__s_00[1].nRef;
        __s_00[2].zErrMsg = (char *)(__s_00 + 0x17);
        __dest = (sqlite3_module *)((long)&__s_00[0x17].pModule + __n + 1);
        __s_00[3].pModule = __dest;
        *(sqlite3 **)&__s_00[2].nRef = db;
        __s_00[0x15].nRef = 1;
        memcpy(__s_00 + 0x17,__s_01,__n);
        memcpy(__dest,__s,(long)(int)sVar3);
        sqlite3Fts3Dequote((char *)(__s_00[1].pModule)->xDestroy);
        *ppVtab = __s_00;
      }
    }
  }
  return iVar2;
}

Assistant:

static int fts3auxConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pUnused,                  /* Unused */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  char const *zDb;                /* Name of database (e.g. "main") */
  char const *zFts3;              /* Name of fts3 table */
  int nDb;                        /* Result of strlen(zDb) */
  int nFts3;                      /* Result of strlen(zFts3) */
  sqlite3_int64 nByte;            /* Bytes of space to allocate here */
  int rc;                         /* value returned by declare_vtab() */
  Fts3auxTable *p;                /* Virtual table object to return */

  UNUSED_PARAMETER(pUnused);

  /* The user should invoke this in one of two forms:
  **
  **     CREATE VIRTUAL TABLE xxx USING fts4aux(fts4-table);
  **     CREATE VIRTUAL TABLE xxx USING fts4aux(fts4-table-db, fts4-table);
  */
  if( argc!=4 && argc!=5 ) goto bad_args;

  zDb = argv[1]; 
  nDb = (int)strlen(zDb);
  if( argc==5 ){
    if( nDb==4 && 0==sqlite3_strnicmp("temp", zDb, 4) ){
      zDb = argv[3]; 
      nDb = (int)strlen(zDb);
      zFts3 = argv[4];
    }else{
      goto bad_args;
    }
  }else{
    zFts3 = argv[3];
  }
  nFts3 = (int)strlen(zFts3);

  rc = sqlite3_declare_vtab(db, FTS3_AUX_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nByte = sizeof(Fts3auxTable) + sizeof(Fts3Table) + nDb + nFts3 + 2;
  p = (Fts3auxTable *)sqlite3_malloc64(nByte);
  if( !p ) return SQLITE_NOMEM;
  memset(p, 0, nByte);

  p->pFts3Tab = (Fts3Table *)&p[1];
  p->pFts3Tab->zDb = (char *)&p->pFts3Tab[1];
  p->pFts3Tab->zName = &p->pFts3Tab->zDb[nDb+1];
  p->pFts3Tab->db = db;
  p->pFts3Tab->nIndex = 1;

  memcpy((char *)p->pFts3Tab->zDb, zDb, nDb);
  memcpy((char *)p->pFts3Tab->zName, zFts3, nFts3);
  sqlite3Fts3Dequote((char *)p->pFts3Tab->zName);

  *ppVtab = (sqlite3_vtab *)p;
  return SQLITE_OK;

 bad_args:
  sqlite3Fts3ErrMsg(pzErr, "invalid arguments to fts4aux constructor");
  return SQLITE_ERROR;
}